

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::AdamOptimizer::MergePartialFromCodedStream
          (AdamOptimizer *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  int iVar5;
  ulong extraout_RAX;
  DoubleParameter *pDVar6;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  Int64Parameter *this_00;
  ulong extraout_RAX_03;
  char cVar7;
  ulong uVar8;
  int local_54;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0025ec59;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0025ec59:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar8 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar4 | uVar8;
    }
    uVar4 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto switchD_0025ecc1_default;
    cVar7 = (char)uVar8;
    switch((uint)(uVar8 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar7 != '\n') break;
      if (this->learningrate_ == (DoubleParameter *)0x0) {
        pDVar6 = (DoubleParameter *)operator_new(0x28);
        DoubleParameter::DoubleParameter(pDVar6);
        this->learningrate_ = pDVar6;
      }
      MergePartialFromCodedStream();
      uVar8 = extraout_RAX;
LAB_0025ee42:
      iVar5 = local_54;
      if ((uVar8 & 1) == 0) goto LAB_0025eca3;
      goto LAB_0025eca5;
    case 2:
      if (cVar7 == '\x12') {
        if (this->minibatchsize_ == (Int64Parameter *)0x0) {
          this_00 = (Int64Parameter *)operator_new(0x28);
          Int64Parameter::Int64Parameter(this_00);
          this->minibatchsize_ = this_00;
        }
        MergePartialFromCodedStream();
        uVar8 = extraout_RAX_03;
        goto LAB_0025ee42;
      }
      break;
    case 3:
      if (cVar7 == '\x1a') {
        if (this->beta1_ == (DoubleParameter *)0x0) {
          pDVar6 = (DoubleParameter *)operator_new(0x28);
          DoubleParameter::DoubleParameter(pDVar6);
          this->beta1_ = pDVar6;
        }
        MergePartialFromCodedStream();
        uVar8 = extraout_RAX_01;
        goto LAB_0025ee42;
      }
      break;
    case 4:
      if (cVar7 == '\"') {
        if (this->beta2_ == (DoubleParameter *)0x0) {
          pDVar6 = (DoubleParameter *)operator_new(0x28);
          DoubleParameter::DoubleParameter(pDVar6);
          this->beta2_ = pDVar6;
        }
        MergePartialFromCodedStream();
        uVar8 = extraout_RAX_02;
        goto LAB_0025ee42;
      }
      break;
    case 5:
      if (cVar7 == '*') {
        if (this->eps_ == (DoubleParameter *)0x0) {
          pDVar6 = (DoubleParameter *)operator_new(0x28);
          DoubleParameter::DoubleParameter(pDVar6);
          this->eps_ = pDVar6;
        }
        MergePartialFromCodedStream();
        uVar8 = extraout_RAX_00;
        goto LAB_0025ee42;
      }
    }
switchD_0025ecc1_default:
    iVar5 = 7;
    if ((uVar4 & 7) != 4 && uVar4 != 0) {
      bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
      if (bVar3) {
LAB_0025eca3:
        iVar5 = 0;
      }
      else {
        iVar5 = 6;
      }
    }
LAB_0025eca5:
    if (iVar5 != 0) {
      return iVar5 != 6;
    }
  } while( true );
}

Assistant:

bool AdamOptimizer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.AdamOptimizer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.DoubleParameter learningRate = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_learningrate()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_minibatchsize()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleParameter beta1 = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_beta1()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleParameter beta2 = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_beta2()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleParameter eps = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_eps()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.AdamOptimizer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.AdamOptimizer)
  return false;
#undef DO_
}